

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_start_domain2(mg_context *ctx,char **options,mg_error_data *error)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *__s2;
  mg_domain_context *pmVar4;
  int iVar5;
  mg_domain_context *__ptr;
  size_t sVar6;
  char *pcVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  __int32_t **pp_Var10;
  bool bVar11;
  uint uVar12;
  undefined8 in_RCX;
  undefined7 uVar14;
  undefined8 uVar13;
  size_t buflen;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *func;
  mg_context *ctx_00;
  char *extraout_RDX_01;
  mg_context *ctx_01;
  int i;
  long lVar15;
  mg_domain_context *pmVar16;
  mg_option *pmVar17;
  char *fmt;
  
  uVar14 = (undefined7)((ulong)in_RCX >> 8);
  if (error == (mg_error_data *)0x0) {
    bVar11 = options == (char **)0x0 || ctx == (mg_context *)0x0;
    uVar13 = CONCAT71(uVar14,bVar11);
    if (bVar11) {
      return -1;
    }
    if (ctx->stop_flag != 0) {
      return -7;
    }
    __ptr = (mg_domain_context *)calloc(1,0x200);
    pcVar7 = extraout_RDX;
    if (__ptr == (mg_domain_context *)0x0) {
      return -6;
    }
  }
  else {
    error->code = 0;
    error->code_sub = 0;
    if (error->text_buffer_size != 0) {
      *error->text = '\0';
    }
    uVar13 = CONCAT71(uVar14,options == (char **)0x0 || ctx == (mg_context *)0x0);
    if (options == (char **)0x0 || ctx == (mg_context *)0x0) {
      error->code = 1;
      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                  "Invalid parameters");
      return -1;
    }
    if (ctx->stop_flag != 0) {
      error->code = 7;
      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                  "Server already stopped");
      return -7;
    }
    __ptr = (mg_domain_context *)calloc(1,0x200);
    pcVar7 = extraout_RDX_00;
    if (__ptr == (mg_domain_context *)0x0) {
      error->code = 6;
      error->code_sub = 0x200;
      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                  "Out or memory");
      return -6;
    }
  }
  uVar12 = (uint)uVar13;
  __s2 = *options;
  while (__s2 != (char *)0x0) {
    pcVar7 = "listening_ports";
    pmVar17 = config_options;
    lVar15 = 0;
    while( true ) {
      pmVar17 = pmVar17 + 1;
      iVar5 = strcmp(pcVar7,__s2);
      uVar12 = (uint)uVar13;
      if (iVar5 == 0) break;
      lVar15 = lVar15 + 1;
      pcVar7 = pmVar17->name;
      if (lVar15 == 0x3a) {
        mg_cry_internal_wrap((mg_connection *)0x0,ctx,func,uVar12,"Invalid option: %s",__s2);
        if (error == (mg_error_data *)0x0) goto LAB_00125b2d;
        error->code = 2;
        error->code_sub = 0xffffffff;
        pcVar7 = error->text;
        buflen = error->text_buffer_size;
        fmt = "Invalid option: %s";
        goto LAB_00125b1f;
      }
    }
    pcVar7 = options[1];
    if (pcVar7 == (char *)0x0) {
      mg_cry_internal_wrap
                ((mg_connection *)0x0,ctx,func,uVar12,"%s: option value cannot be NULL",__s2);
      if (error != (mg_error_data *)0x0) {
        error->code = 2;
        error->code_sub = (uint)lVar15;
        pcVar7 = error->text;
        buflen = error->text_buffer_size;
        fmt = "Invalid option value: %s";
LAB_00125b1f:
        mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar7,buflen,fmt,__s2);
      }
LAB_00125b2d:
      free(__ptr);
      return -2;
    }
    if (__ptr->config[lVar15] != (char *)0x0) {
      mg_cry_internal_wrap
                ((mg_connection *)0x0,ctx,func,uVar12,"warning: %s: duplicate option",__s2);
      free(__ptr->config[lVar15]);
    }
    options = options + 2;
    sVar6 = strlen(pcVar7);
    pcVar7 = mg_strndup_ctx(pcVar7,sVar6,ctx_00);
    uVar12 = (uint)uVar13;
    __ptr->config[lVar15] = pcVar7;
    pcVar7 = extraout_RDX_01;
    __s2 = *options;
  }
  if (__ptr->config[0x1e] == (char *)0x0) {
    mg_cry_internal_wrap
              ((mg_connection *)0x0,ctx,pcVar7,uVar12,"%s","authentication domain required");
    if (error != (mg_error_data *)0x0) {
      error->code = 4;
      error->code_sub = 0x1e;
      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                  "Mandatory option %s missing","authentication_domain");
    }
    free(__ptr);
    iVar5 = -4;
  }
  else {
    lVar15 = 0;
    do {
      if ((__ptr->config[lVar15] == (char *)0x0) &&
         (pcVar7 = (ctx->dd).config[lVar15], pcVar7 != (char *)0x0)) {
        sVar6 = strlen(pcVar7);
        pcVar7 = mg_strndup_ctx(pcVar7,sVar6,ctx_01);
        __ptr->config[lVar15] = pcVar7;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x3a);
    __ptr->handlers = (mg_handler_info *)0x0;
    __ptr->nonce_count = 0;
    __ptr->next = (mg_domain_context *)0x0;
    uVar8 = get_random();
    uVar9 = get_random();
    __ptr->auth_nonce_mask = uVar9 << 0x1f ^ uVar8;
    if (ctx->context_type == 1) {
      pthread_mutex_lock((pthread_mutex_t *)&ctx->nonce_mutex);
    }
    pcVar7 = __ptr->config[0x1e];
    pp_Var10 = __ctype_tolower_loc();
    iVar5 = 0;
    pmVar4 = &ctx->dd;
    do {
      pmVar16 = pmVar4;
      lVar15 = 0;
      do {
        bVar1 = pcVar7[lVar15];
        iVar2 = (*pp_Var10)[bVar1];
        iVar3 = (*pp_Var10)[(byte)pmVar16->config[0x1e][lVar15]];
        if (bVar1 == 0) break;
        lVar15 = lVar15 + 1;
      } while (iVar2 == iVar3);
      if (iVar2 == iVar3) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,ctx,pmVar16->config[0x1e],(uint)pmVar16,
                   "domain %s already in use",pcVar7);
        if (error != (mg_error_data *)0x0) {
          error->code = 5;
          mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,
                      "Domain %s specified by %s is already in use",__ptr->config[0x1e],
                      "authentication_domain");
        }
        free(__ptr);
        iVar5 = -5;
        goto LAB_00125c3e;
      }
      iVar5 = iVar5 + 1;
      pmVar4 = pmVar16->next;
    } while (pmVar16->next != (mg_domain_context *)0x0);
    pmVar16->next = __ptr;
LAB_00125c3e:
    if (ctx->context_type == 1) {
      pthread_mutex_unlock((pthread_mutex_t *)&ctx->nonce_mutex);
    }
  }
  return iVar5;
}

Assistant:

CIVETWEB_API int
mg_start_domain2(struct mg_context *ctx,
                 const char **options,
                 struct mg_error_data *error)
{
	const char *name;
	const char *value;
	const char *default_value;
	struct mg_domain_context *new_dom;
	struct mg_domain_context *dom;
	int idx, i;

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			*error->text = 0;
		}
	}

	if ((ctx == NULL) || (options == NULL)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_PARAM;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Invalid parameters");
		}
		return -1;
	}

	if (!STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_SERVER_STOPPED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Server already stopped");
		}
		return -7;
	}

	new_dom = (struct mg_domain_context *)
	    mg_calloc_ctx(1, sizeof(struct mg_domain_context), ctx);

	if (!new_dom) {
		/* Out of memory */
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)sizeof(struct mg_domain_context);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Out or memory");
		}
		return -6;
	}

	/* Store options - TODO: unite duplicate code */
	while (options && (name = *options++) != NULL) {
		idx = get_option_index(name);
		if (idx == -1) {
			mg_cry_ctx_internal(ctx, "Invalid option: %s", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)-1;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid option: %s",
				            name);
			}
			mg_free(new_dom);
			return -2;
		} else if ((value = *options++) == NULL) {
			mg_cry_ctx_internal(ctx, "%s: option value cannot be NULL", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)idx;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid option value: %s",
				            name);
			}
			mg_free(new_dom);
			return -2;
		}
		if (new_dom->config[idx] != NULL) {
			/* Duplicate option: Later values overwrite earlier ones. */
			mg_cry_ctx_internal(ctx, "warning: %s: duplicate option", name);
			mg_free(new_dom->config[idx]);
		}
		new_dom->config[idx] = mg_strdup_ctx(value, ctx);
		DEBUG_TRACE("[%s] -> [%s]", name, value);
	}

	/* Authentication domain is mandatory */
	/* TODO: Maybe use a new option hostname? */
	if (!new_dom->config[AUTHENTICATION_DOMAIN]) {
		mg_cry_ctx_internal(ctx, "%s", "authentication domain required");
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_MISSING_OPTION;
			error->code_sub = AUTHENTICATION_DOMAIN;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Mandatory option %s missing",
			            config_options[AUTHENTICATION_DOMAIN].name);
		}
		mg_free(new_dom);
		return -4;
	}

	/* Set default value if needed. Take the config value from
	 * ctx as a default value. */
	for (i = 0; config_options[i].name != NULL; i++) {
		default_value = ctx->dd.config[i];
		if ((new_dom->config[i] == NULL) && (default_value != NULL)) {
			new_dom->config[i] = mg_strdup_ctx(default_value, ctx);
		}
	}

	new_dom->handlers = NULL;
	new_dom->next = NULL;
	new_dom->nonce_count = 0;
	new_dom->auth_nonce_mask = get_random() ^ (get_random() << 31);

#if defined(USE_LUA) && defined(USE_WEBSOCKET)
	new_dom->shared_lua_websockets = NULL;
#endif

#if !defined(NO_SSL) && !defined(USE_MBEDTLS)
	if (!init_ssl_ctx(ctx, new_dom)) {
		/* Init SSL failed */
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Initializing SSL context failed");
		}
		mg_free(new_dom);
		return -3;
	}
#endif

	/* Add element to linked list. */
	mg_lock_context(ctx);

	idx = 0;
	dom = &(ctx->dd);
	for (;;) {
		if (!mg_strcasecmp(new_dom->config[AUTHENTICATION_DOMAIN],
		                   dom->config[AUTHENTICATION_DOMAIN])) {
			/* Domain collision */
			mg_cry_ctx_internal(ctx,
			                    "domain %s already in use",
			                    new_dom->config[AUTHENTICATION_DOMAIN]);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_DUPLICATE_DOMAIN;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Domain %s specified by %s is already in use",
				            new_dom->config[AUTHENTICATION_DOMAIN],
				            config_options[AUTHENTICATION_DOMAIN].name);
			}
			mg_free(new_dom);
			mg_unlock_context(ctx);
			return -5;
		}

		/* Count number of domains */
		idx++;

		if (dom->next == NULL) {
			dom->next = new_dom;
			break;
		}
		dom = dom->next;
	}

	mg_unlock_context(ctx);

	/* Return domain number */
	return idx;
}